

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *descriptor)

{
  int i;
  ulong uVar1;
  vector<int,_std::allocator<int>_> path;
  Annotation annotation;
  _Vector_base<int,_std::allocator<int>_> local_78;
  GeneratedCodeInfo_Annotation local_60;
  
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FieldDescriptor::GetLocationPath(descriptor,(vector<int,_std::allocator<int>_> *)&local_78);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(&local_60);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_78._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    GeneratedCodeInfo_Annotation::_internal_add_path
              (&local_60,local_78._M_impl.super__Vector_impl_data._M_start[uVar1]);
  }
  GeneratedCodeInfo_Annotation::_internal_set_source_file
            (&local_60,(string *)**(undefined8 **)(descriptor + 0x28));
  MessageLite::SerializeAsString_abi_cxx11_(__return_storage_ptr__,(MessageLite *)&local_60);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int i = 0; i < path.size(); ++i) {
      annotation.add_path(path[i]);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }